

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorK<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  vfloat<4> vVar2;
  vfloat<4> vVar3;
  size_t sVar4;
  size_t sVar5;
  undefined4 uVar6;
  uint uVar7;
  ulong uVar8;
  ulong extraout_RDX;
  long lVar9;
  NodeRef *pNVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  size_t in_R9;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar17;
  bool bVar18;
  float fVar24;
  float fVar25;
  vint4 bi;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar27;
  float fVar28;
  float fVar31;
  float fVar32;
  vint4 bi_1;
  undefined1 auVar29 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  float fVar33;
  float fVar37;
  float fVar38;
  vint4 ai;
  float fVar39;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar40;
  float fVar42;
  float fVar43;
  vint4 ai_1;
  undefined1 auVar41 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  vint4 ai_3;
  float fVar51;
  float fVar52;
  uint uVar57;
  uint uVar58;
  vint4 bi_2;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint uVar59;
  undefined1 auVar56 [16];
  float fVar60;
  float fVar63;
  float fVar64;
  vint4 bi_3;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar65;
  uint uVar68;
  uint uVar69;
  vint4 ai_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar70;
  undefined1 auVar71 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar72 [16];
  undefined1 in_XMM12 [16];
  undefined1 in_XMM13 [16];
  int iVar73;
  int iVar74;
  int iVar75;
  vint<4> octant;
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid_leaf;
  undefined1 local_1768 [16];
  RayQueryContext *local_1750;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar55._8_4_ = 0xffffffff;
    auVar55._0_8_ = 0xffffffffffffffff;
    auVar55._12_4_ = 0xffffffff;
    auVar41._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
    auVar41._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
    auVar41._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
    auVar41._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
    iVar11 = movmskps((int)This,auVar41);
    uVar12 = CONCAT44((int)((ulong)This >> 0x20),iVar11);
    if (iVar11 != 0) {
      local_16f8 = *(float *)ray;
      fStack_16f4 = *(float *)(ray + 4);
      fStack_16f0 = *(float *)(ray + 8);
      fStack_16ec = *(float *)(ray + 0xc);
      auVar54 = *(undefined1 (*) [16])(ray + 0x40);
      fVar45 = (float)DAT_01ff1d40;
      fVar47 = DAT_01ff1d40._4_4_;
      fVar49 = DAT_01ff1d40._8_4_;
      fVar51 = DAT_01ff1d40._12_4_;
      auVar71._4_4_ = -(uint)(ABS(auVar54._4_4_) < fVar47);
      auVar71._0_4_ = -(uint)(ABS(auVar54._0_4_) < fVar45);
      auVar71._8_4_ = -(uint)(ABS(auVar54._8_4_) < fVar49);
      auVar71._12_4_ = -(uint)(ABS(auVar54._12_4_) < fVar51);
      auVar61 = blendvps(auVar54,_DAT_01ff1d40,auVar71);
      auVar71 = *(undefined1 (*) [16])(ray + 0x50);
      auVar66._4_4_ = -(uint)(ABS(auVar71._4_4_) < fVar47);
      auVar66._0_4_ = -(uint)(ABS(auVar71._0_4_) < fVar45);
      auVar66._8_4_ = -(uint)(ABS(auVar71._8_4_) < fVar49);
      auVar66._12_4_ = -(uint)(ABS(auVar71._12_4_) < fVar51);
      auVar66 = blendvps(auVar71,_DAT_01ff1d40,auVar66);
      auVar71 = *(undefined1 (*) [16])(ray + 0x60);
      auVar72._4_4_ = -(uint)(ABS(auVar71._4_4_) < fVar47);
      auVar72._0_4_ = -(uint)(ABS(auVar71._0_4_) < fVar45);
      auVar72._8_4_ = -(uint)(ABS(auVar71._8_4_) < fVar49);
      auVar72._12_4_ = -(uint)(ABS(auVar71._12_4_) < fVar51);
      auVar71 = blendvps(auVar71,_DAT_01ff1d40,auVar72);
      auVar72 = rcpps(in_XMM11,auVar61);
      local_1708 = auVar72._0_4_;
      fStack_1704 = auVar72._4_4_;
      fStack_1700 = auVar72._8_4_;
      fStack_16fc = auVar72._12_4_;
      auVar72 = rcpps(in_XMM12,auVar66);
      local_1718 = auVar72._0_4_;
      fStack_1714 = auVar72._4_4_;
      fStack_1710 = auVar72._8_4_;
      fStack_170c = auVar72._12_4_;
      auVar72 = rcpps(in_XMM13,auVar71);
      local_1728 = auVar72._0_4_;
      fStack_1724 = auVar72._4_4_;
      fStack_1720 = auVar72._8_4_;
      fStack_171c = auVar72._12_4_;
      auVar53._0_8_ =
           CONCAT44(-(uint)(auVar54._4_4_ < 0.0),-(uint)(auVar54._0_4_ < 0.0)) & 0x100000001;
      auVar53._8_4_ = -(uint)(auVar54._8_4_ < 0.0) & 1;
      auVar53._12_4_ = -(uint)(auVar54._12_4_ < 0.0) & 1;
      auVar67._0_8_ =
           CONCAT44(-(uint)(*(float *)(ray + 0x54) < 0.0),-(uint)(*(float *)(ray + 0x50) < 0.0)) &
           0x200000002;
      auVar67._8_4_ = -(uint)(*(float *)(ray + 0x58) < 0.0) & 2;
      auVar67._12_4_ = -(uint)(*(float *)(ray + 0x5c) < 0.0) & 2;
      local_1738 = *(float *)(ray + 0x10);
      fStack_1734 = *(float *)(ray + 0x14);
      fStack_1730 = *(float *)(ray + 0x18);
      fStack_172c = *(float *)(ray + 0x1c);
      local_1748 = *(float *)(ray + 0x20);
      fStack_1744 = *(float *)(ray + 0x24);
      fStack_1740 = *(float *)(ray + 0x28);
      fStack_173c = *(float *)(ray + 0x2c);
      auVar54._0_8_ =
           CONCAT44(-(uint)(*(float *)(ray + 100) < 0.0),-(uint)(*(float *)(ray + 0x60) < 0.0)) &
           0x400000004;
      auVar54._8_4_ = -(uint)(*(float *)(ray + 0x68) < 0.0) & 4;
      auVar54._12_4_ = -(uint)(*(float *)(ray + 0x6c) < 0.0) & 4;
      local_1768 = auVar41 ^ auVar55 | auVar54 | auVar67 | auVar53;
      do {
        lVar9 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        iVar11 = *(int *)(local_1768 + lVar9 * 4);
        auVar62._0_4_ = -(uint)(iVar11 == local_1768._0_4_);
        auVar62._4_4_ = -(uint)(iVar11 == local_1768._4_4_);
        auVar62._8_4_ = -(uint)(iVar11 == local_1768._8_4_);
        auVar62._12_4_ = -(uint)(iVar11 == local_1768._12_4_);
        uVar6 = movmskps((int)lVar9,auVar62);
        uVar8 = ~CONCAT44((int)((ulong)lVar9 >> 0x20),uVar6);
        uVar12 = uVar12 & uVar8;
      } while (uVar12 != 0);
      auVar26._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
      auVar26._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
      auVar26._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
      auVar26._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
      local_1708 = local_1708 + (1.0 - auVar61._0_4_ * local_1708) * local_1708;
      fStack_1704 = fStack_1704 + (1.0 - auVar61._4_4_ * fStack_1704) * fStack_1704;
      fStack_1700 = fStack_1700 + (1.0 - auVar61._8_4_ * fStack_1700) * fStack_1700;
      fStack_16fc = fStack_16fc + (1.0 - auVar61._12_4_ * fStack_16fc) * fStack_16fc;
      local_1718 = local_1718 + (1.0 - auVar66._0_4_ * local_1718) * local_1718;
      fStack_1714 = fStack_1714 + (1.0 - auVar66._4_4_ * fStack_1714) * fStack_1714;
      fStack_1710 = fStack_1710 + (1.0 - auVar66._8_4_ * fStack_1710) * fStack_1710;
      fStack_170c = fStack_170c + (1.0 - auVar66._12_4_ * fStack_170c) * fStack_170c;
      local_1728 = local_1728 + (1.0 - auVar71._0_4_ * local_1728) * local_1728;
      fStack_1724 = fStack_1724 + (1.0 - auVar71._4_4_ * fStack_1724) * fStack_1724;
      fStack_1720 = fStack_1720 + (1.0 - auVar71._8_4_ * fStack_1720) * fStack_1720;
      fStack_171c = fStack_171c + (1.0 - auVar71._12_4_ * fStack_171c) * fStack_171c;
      auVar41 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      auVar55 = maxps(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0));
      iVar11 = (int)DAT_01feb9f0;
      iVar73 = DAT_01feb9f0._4_4_;
      iVar74 = DAT_01feb9f0._8_4_;
      iVar75 = DAT_01feb9f0._12_4_;
      local_16e8.v = (__m128)blendvps(_DAT_01feb9f0,auVar41,auVar26);
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     blendvps(_DAT_01feba00,auVar55,auVar26);
      pNVar10 = stack_node + 2;
      paVar17 = &stack_near[2].field_0;
      local_1768 = auVar26 | local_1768;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      sVar5 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      stack_node[1].ptr = sVar5;
      stack_near[1].field_0 = local_16e8;
      local_1750 = context;
      do {
        paVar17 = paVar17 + -1;
        pNVar1 = pNVar10 + -1;
        pNVar10 = pNVar10 + -1;
        sVar5 = CONCAT71((int7)(sVar5 >> 8),1);
        if (pNVar1->ptr != 0xfffffffffffffff8) {
          aVar30.v = *(__m128 *)paVar17->v;
          auVar61._4_4_ = -(uint)(aVar30.v[1] < (float)bi_8.field_0.i[1]);
          auVar61._0_4_ = -(uint)(aVar30.v[0] < (float)bi_8.field_0.i[0]);
          auVar61._8_4_ = -(uint)(aVar30.v[2] < (float)bi_8.field_0.i[2]);
          auVar61._12_4_ = -(uint)(aVar30.v[3] < (float)bi_8.field_0.i[3]);
          uVar7 = movmskps((int)uVar8,auVar61);
          uVar8 = (ulong)uVar7;
          sVar15 = pNVar1->ptr;
          if (uVar7 != 0) {
            do {
              if ((sVar15 & 8) != 0) {
                if (sVar15 == 0xfffffffffffffff8) goto LAB_002596bd;
                valid_leaf.field_0.i[1] = -(uint)(aVar30.v[1] < (float)bi_8.field_0.i[1]);
                valid_leaf.field_0.i[0] = -(uint)(aVar30.v[0] < (float)bi_8.field_0.i[0]);
                valid_leaf.field_0.i[2] = -(uint)(aVar30.v[2] < (float)bi_8.field_0.i[2]);
                valid_leaf.field_0.i[3] = -(uint)(aVar30.v[3] < (float)bi_8.field_0.i[3]);
                iVar13 = movmskps((int)sVar5,(undefined1  [16])valid_leaf.field_0);
                if (iVar13 != 0) {
                  lVar9 = (ulong)((uint)sVar15 & 0xf) - 8;
                  if (lVar9 != 0) {
                    prim = (Primitive_conflict4 *)(sVar15 & 0xfffffffffffffff0);
                    do {
                      InstanceArrayIntersectorK<4>::intersect(&valid_leaf,&pre,ray,local_1750,prim);
                      prim = prim + 1;
                      lVar9 = lVar9 + -1;
                      uVar8 = extraout_RDX;
                    } while (lVar9 != 0);
                  }
                  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                 blendvps((undefined1  [16])bi_8.field_0,
                                          *(undefined1 (*) [16])(ray + 0x80),
                                          (undefined1  [16])valid_leaf.field_0);
                  iVar11 = 0x7f800000;
                  iVar73 = 0x7f800000;
                  iVar74 = 0x7f800000;
                  iVar75 = 0x7f800000;
                }
                break;
              }
              uVar14 = 0;
              aVar27.i[1] = iVar73;
              aVar27.i[0] = iVar11;
              aVar27.i[2] = iVar74;
              aVar27.i[3] = iVar75;
              uVar12 = 0;
              sVar16 = 8;
              do {
                sVar4 = *(size_t *)((sVar15 & 0xfffffffffffffff0) + uVar12 * 8);
                aVar30 = aVar27;
                if (sVar4 != 8) {
                  fVar45 = *(float *)(sVar15 + 0x20 + uVar12 * 4);
                  fVar47 = *(float *)(sVar15 + 0x30 + uVar12 * 4);
                  fVar49 = *(float *)(sVar15 + 0x40 + uVar12 * 4);
                  fVar51 = *(float *)(sVar15 + 0x50 + uVar12 * 4);
                  fVar33 = (fVar45 - local_16f8) * local_1708;
                  fVar37 = (fVar45 - fStack_16f4) * fStack_1704;
                  fVar38 = (fVar45 - fStack_16f0) * fStack_1700;
                  fVar39 = (fVar45 - fStack_16ec) * fStack_16fc;
                  fVar40 = (fVar49 - local_1738) * local_1718;
                  fVar42 = (fVar49 - fStack_1734) * fStack_1714;
                  fVar43 = (fVar49 - fStack_1730) * fStack_1710;
                  fVar44 = (fVar49 - fStack_172c) * fStack_170c;
                  fVar45 = *(float *)(sVar15 + 0x60 + uVar12 * 4);
                  fVar46 = (fVar45 - local_1748) * local_1728;
                  fVar48 = (fVar45 - fStack_1744) * fStack_1724;
                  fVar50 = (fVar45 - fStack_1740) * fStack_1720;
                  fVar52 = (fVar45 - fStack_173c) * fStack_171c;
                  fVar49 = (fVar47 - local_16f8) * local_1708;
                  fVar24 = (fVar47 - fStack_16f4) * fStack_1704;
                  fVar25 = (fVar47 - fStack_16f0) * fStack_1700;
                  fVar47 = (fVar47 - fStack_16ec) * fStack_16fc;
                  fVar28 = (fVar51 - local_1738) * local_1718;
                  fVar31 = (fVar51 - fStack_1734) * fStack_1714;
                  fVar32 = (fVar51 - fStack_1730) * fStack_1710;
                  fVar51 = (fVar51 - fStack_172c) * fStack_170c;
                  fVar45 = *(float *)(sVar15 + 0x70 + uVar12 * 4);
                  fVar60 = (fVar45 - local_1748) * local_1728;
                  fVar63 = (fVar45 - fStack_1744) * fStack_1724;
                  fVar64 = (fVar45 - fStack_1740) * fStack_1720;
                  fVar45 = (fVar45 - fStack_173c) * fStack_171c;
                  uVar7 = (uint)((int)fVar49 < (int)fVar33) * (int)fVar49 |
                          (uint)((int)fVar49 >= (int)fVar33) * (int)fVar33;
                  uVar57 = (uint)((int)fVar24 < (int)fVar37) * (int)fVar24 |
                           (uint)((int)fVar24 >= (int)fVar37) * (int)fVar37;
                  uVar58 = (uint)((int)fVar25 < (int)fVar38) * (int)fVar25 |
                           (uint)((int)fVar25 >= (int)fVar38) * (int)fVar38;
                  uVar59 = (uint)((int)fVar47 < (int)fVar39) * (int)fVar47 |
                           (uint)((int)fVar47 >= (int)fVar39) * (int)fVar39;
                  uVar65 = (uint)((int)fVar28 < (int)fVar40) * (int)fVar28 |
                           (uint)((int)fVar28 >= (int)fVar40) * (int)fVar40;
                  uVar68 = (uint)((int)fVar31 < (int)fVar42) * (int)fVar31 |
                           (uint)((int)fVar31 >= (int)fVar42) * (int)fVar42;
                  uVar69 = (uint)((int)fVar32 < (int)fVar43) * (int)fVar32 |
                           (uint)((int)fVar32 >= (int)fVar43) * (int)fVar43;
                  uVar70 = (uint)((int)fVar51 < (int)fVar44) * (int)fVar51 |
                           (uint)((int)fVar51 >= (int)fVar44) * (int)fVar44;
                  uVar65 = ((int)uVar65 < (int)uVar7) * uVar7 | ((int)uVar65 >= (int)uVar7) * uVar65
                  ;
                  uVar68 = ((int)uVar68 < (int)uVar57) * uVar57 |
                           ((int)uVar68 >= (int)uVar57) * uVar68;
                  uVar69 = ((int)uVar69 < (int)uVar58) * uVar58 |
                           ((int)uVar69 >= (int)uVar58) * uVar69;
                  uVar70 = ((int)uVar70 < (int)uVar59) * uVar59 |
                           ((int)uVar70 >= (int)uVar59) * uVar70;
                  uVar7 = (uint)((int)fVar60 < (int)fVar46) * (int)fVar60 |
                          (uint)((int)fVar60 >= (int)fVar46) * (int)fVar46;
                  uVar57 = (uint)((int)fVar63 < (int)fVar48) * (int)fVar63 |
                           (uint)((int)fVar63 >= (int)fVar48) * (int)fVar48;
                  uVar58 = (uint)((int)fVar64 < (int)fVar50) * (int)fVar64 |
                           (uint)((int)fVar64 >= (int)fVar50) * (int)fVar50;
                  uVar59 = (uint)((int)fVar45 < (int)fVar52) * (int)fVar45 |
                           (uint)((int)fVar45 >= (int)fVar52) * (int)fVar52;
                  auVar56._0_4_ =
                       ((int)uVar7 < (int)uVar65) * uVar65 | ((int)uVar7 >= (int)uVar65) * uVar7;
                  auVar56._4_4_ =
                       ((int)uVar57 < (int)uVar68) * uVar68 | ((int)uVar57 >= (int)uVar68) * uVar57;
                  auVar56._8_4_ =
                       ((int)uVar58 < (int)uVar69) * uVar69 | ((int)uVar58 >= (int)uVar69) * uVar58;
                  auVar56._12_4_ =
                       ((int)uVar59 < (int)uVar70) * uVar70 | ((int)uVar59 >= (int)uVar70) * uVar59;
                  uVar7 = (uint)((int)fVar49 < (int)fVar33) * (int)fVar33 |
                          (uint)((int)fVar49 >= (int)fVar33) * (int)fVar49;
                  uVar57 = (uint)((int)fVar24 < (int)fVar37) * (int)fVar37 |
                           (uint)((int)fVar24 >= (int)fVar37) * (int)fVar24;
                  uVar58 = (uint)((int)fVar25 < (int)fVar38) * (int)fVar38 |
                           (uint)((int)fVar25 >= (int)fVar38) * (int)fVar25;
                  uVar59 = (uint)((int)fVar47 < (int)fVar39) * (int)fVar39 |
                           (uint)((int)fVar47 >= (int)fVar39) * (int)fVar47;
                  uVar65 = (uint)((int)fVar28 < (int)fVar40) * (int)fVar40 |
                           (uint)((int)fVar28 >= (int)fVar40) * (int)fVar28;
                  uVar68 = (uint)((int)fVar31 < (int)fVar42) * (int)fVar42 |
                           (uint)((int)fVar31 >= (int)fVar42) * (int)fVar31;
                  uVar69 = (uint)((int)fVar32 < (int)fVar43) * (int)fVar43 |
                           (uint)((int)fVar32 >= (int)fVar43) * (int)fVar32;
                  uVar70 = (uint)((int)fVar51 < (int)fVar44) * (int)fVar44 |
                           (uint)((int)fVar51 >= (int)fVar44) * (int)fVar51;
                  uVar7 = ((int)uVar7 < (int)uVar65) * uVar7 | ((int)uVar7 >= (int)uVar65) * uVar65;
                  uVar57 = ((int)uVar57 < (int)uVar68) * uVar57 |
                           ((int)uVar57 >= (int)uVar68) * uVar68;
                  uVar58 = ((int)uVar58 < (int)uVar69) * uVar58 |
                           ((int)uVar58 >= (int)uVar69) * uVar69;
                  uVar59 = ((int)uVar59 < (int)uVar70) * uVar59 |
                           ((int)uVar59 >= (int)uVar70) * uVar70;
                  uVar65 = (uint)((int)fVar60 < (int)fVar46) * (int)fVar46 |
                           (uint)((int)fVar60 >= (int)fVar46) * (int)fVar60;
                  uVar68 = (uint)((int)fVar63 < (int)fVar48) * (int)fVar48 |
                           (uint)((int)fVar63 >= (int)fVar48) * (int)fVar63;
                  uVar69 = (uint)((int)fVar64 < (int)fVar50) * (int)fVar50 |
                           (uint)((int)fVar64 >= (int)fVar50) * (int)fVar64;
                  uVar70 = (uint)((int)fVar45 < (int)fVar52) * (int)fVar52 |
                           (uint)((int)fVar45 >= (int)fVar52) * (int)fVar45;
                  uVar65 = (uint)(bi_8.field_0.i[0] < (int)uVar65) * bi_8.field_0.i[0] |
                           (bi_8.field_0.i[0] >= (int)uVar65) * uVar65;
                  uVar68 = (uint)(bi_8.field_0.i[1] < (int)uVar68) * bi_8.field_0.i[1] |
                           (bi_8.field_0.i[1] >= (int)uVar68) * uVar68;
                  uVar69 = (uint)(bi_8.field_0.i[2] < (int)uVar69) * bi_8.field_0.i[2] |
                           (bi_8.field_0.i[2] >= (int)uVar69) * uVar69;
                  uVar70 = (uint)(bi_8.field_0.i[3] < (int)uVar70) * bi_8.field_0.i[3] |
                           (bi_8.field_0.i[3] >= (int)uVar70) * uVar70;
                  auVar19._4_4_ =
                       -(uint)((float)((uint)((int)auVar56._4_4_ < (int)local_16e8._4_4_) *
                                       local_16e8._4_4_ |
                                      ((int)auVar56._4_4_ >= (int)local_16e8._4_4_) * auVar56._4_4_)
                              <= (float)(((int)uVar57 < (int)uVar68) * uVar57 |
                                        ((int)uVar57 >= (int)uVar68) * uVar68));
                  auVar19._0_4_ =
                       -(uint)((float)((uint)((int)auVar56._0_4_ < (int)local_16e8._0_4_) *
                                       local_16e8._0_4_ |
                                      ((int)auVar56._0_4_ >= (int)local_16e8._0_4_) * auVar56._0_4_)
                              <= (float)(((int)uVar7 < (int)uVar65) * uVar7 |
                                        ((int)uVar7 >= (int)uVar65) * uVar65));
                  auVar19._8_4_ =
                       -(uint)((float)((uint)((int)auVar56._8_4_ < (int)local_16e8._8_4_) *
                                       local_16e8._8_4_ |
                                      ((int)auVar56._8_4_ >= (int)local_16e8._8_4_) * auVar56._8_4_)
                              <= (float)(((int)uVar58 < (int)uVar69) * uVar58 |
                                        ((int)uVar58 >= (int)uVar69) * uVar69));
                  auVar19._12_4_ =
                       -(uint)((float)((uint)((int)auVar56._12_4_ < (int)local_16e8._12_4_) *
                                       local_16e8._12_4_ |
                                      ((int)auVar56._12_4_ >= (int)local_16e8._12_4_) *
                                      auVar56._12_4_) <=
                              (float)(((int)uVar59 < (int)uVar70) * uVar59 |
                                     ((int)uVar59 >= (int)uVar70) * uVar70));
                  uVar7 = movmskps((int)in_R9,auVar19);
                  in_R9 = (ulong)uVar7;
                  if (uVar7 != 0) {
                    auVar29._4_4_ = iVar73;
                    auVar29._0_4_ = iVar11;
                    auVar29._8_4_ = iVar74;
                    auVar29._12_4_ = iVar75;
                    aVar30 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             blendvps(auVar29,auVar56,auVar19);
                    auVar20._4_4_ = -(uint)(aVar30.v[1] < aVar27.v[1]);
                    auVar20._0_4_ = -(uint)(aVar30.v[0] < aVar27.v[0]);
                    auVar20._8_4_ = -(uint)(aVar30.v[2] < aVar27.v[2]);
                    auVar20._12_4_ = -(uint)(aVar30.v[3] < aVar27.v[3]);
                    iVar13 = movmskps(uVar7,auVar20);
                    in_R9 = sVar4;
                    aVar21 = aVar30;
                    if ((iVar13 == 0) ||
                       (bVar18 = sVar16 != 8, in_R9 = sVar16, sVar16 = sVar4, aVar21 = aVar27,
                       aVar27 = aVar30, bVar18)) {
                      aVar30 = aVar27;
                      uVar14 = uVar14 + 1;
                      pNVar10->ptr = in_R9;
                      pNVar10 = pNVar10 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17->v = aVar21;
                      paVar17 = paVar17 + 1;
                    }
                  }
                }
              } while ((sVar4 != 8) &&
                      (bVar18 = uVar12 < 3, uVar12 = uVar12 + 1, aVar27 = aVar30, bVar18));
              uVar8 = CONCAT71((int7)(sVar15 >> 8),sVar16 != 8);
              if (1 < uVar14 && sVar16 != 8) {
                vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17[-2].v;
                vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17[-1].v;
                auVar34._4_4_ = -(uint)(vVar2.field_0._4_4_ < vVar3.field_0._4_4_);
                auVar34._0_4_ = -(uint)(vVar2.field_0._0_4_ < vVar3.field_0._0_4_);
                auVar34._8_4_ = -(uint)(vVar2.field_0._8_4_ < vVar3.field_0._8_4_);
                auVar34._12_4_ = -(uint)(vVar2.field_0._12_4_ < vVar3.field_0._12_4_);
                uVar7 = movmskps((int)uVar8,auVar34);
                uVar8 = (ulong)uVar7;
                if (uVar7 != 0) {
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17[-2].v = vVar3.field_0;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17[-1].v = vVar2.field_0;
                  auVar41 = *(undefined1 (*) [16])(pNVar10 + -2);
                  auVar22._0_8_ = auVar41._8_8_;
                  auVar22._8_4_ = auVar41._0_4_;
                  auVar22._12_4_ = auVar41._4_4_;
                  *(undefined1 (*) [16])(pNVar10 + -2) = auVar22;
                }
                if (uVar14 != 2) {
                  fVar45 = paVar17[-3].v[0];
                  fVar47 = *(float *)((long)paVar17 + -0x2c);
                  fVar49 = *(float *)((long)paVar17 + -0x28);
                  fVar51 = *(float *)((long)paVar17 + -0x24);
                  auVar35._4_4_ = -(uint)(fVar47 < *(float *)((long)paVar17 + -0xc));
                  auVar35._0_4_ = -(uint)(fVar45 < paVar17[-1].v[0]);
                  auVar35._8_4_ = -(uint)(fVar49 < *(float *)((long)paVar17 + -8));
                  auVar35._12_4_ = -(uint)(fVar51 < *(float *)((long)paVar17 + -4));
                  uVar7 = movmskps(uVar7,auVar35);
                  uVar12 = (ulong)uVar7;
                  if (uVar7 != 0) {
                    paVar17[-3].v[0] = paVar17[-1].v[0];
                    *(float *)((long)paVar17 + -0x2c) = *(float *)((long)paVar17 + -0xc);
                    *(float *)((long)paVar17 + -0x28) = *(float *)((long)paVar17 + -8);
                    *(float *)((long)paVar17 + -0x24) = *(float *)((long)paVar17 + -4);
                    paVar17[-1].v[0] = fVar45;
                    *(float *)((long)paVar17 + -0xc) = fVar47;
                    *(float *)((long)paVar17 + -8) = fVar49;
                    *(float *)((long)paVar17 + -4) = fVar51;
                    sVar15 = pNVar10[-3].ptr;
                    uVar12 = pNVar10[-1].ptr;
                    pNVar10[-3].ptr = uVar12;
                    pNVar10[-1].ptr = sVar15;
                  }
                  vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17[-3].v;
                  vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17[-2].v;
                  auVar36._4_4_ = -(uint)(vVar2.field_0._4_4_ < vVar3.field_0._4_4_);
                  auVar36._0_4_ = -(uint)(vVar2.field_0._0_4_ < vVar3.field_0._0_4_);
                  auVar36._8_4_ = -(uint)(vVar2.field_0._8_4_ < vVar3.field_0._8_4_);
                  auVar36._12_4_ = -(uint)(vVar2.field_0._12_4_ < vVar3.field_0._12_4_);
                  uVar7 = movmskps((int)uVar12,auVar36);
                  uVar8 = (ulong)uVar7;
                  if (uVar7 != 0) {
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17[-3].v = vVar3.field_0;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17[-2].v = vVar2.field_0;
                    auVar41 = *(undefined1 (*) [16])(pNVar10 + -3);
                    auVar23._0_8_ = auVar41._8_8_;
                    auVar23._8_4_ = auVar41._0_4_;
                    auVar23._12_4_ = auVar41._4_4_;
                    *(undefined1 (*) [16])(pNVar10 + -3) = auVar23;
                  }
                }
              }
              sVar15 = sVar16;
            } while (sVar16 != 8);
          }
          sVar5 = 0;
        }
LAB_002596bd:
      } while ((char)sVar5 == '\0');
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }